

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Visitor<wasm::PrintSExpression,_void>::visit
          (Visitor<wasm::PrintSExpression,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      PrintSExpression::visitBlock((PrintSExpression *)this,(Block *)curr);
      return;
    case IfId:
      PrintSExpression::visitIf((PrintSExpression *)this,(If *)curr);
      return;
    case LoopId:
      PrintSExpression::visitLoop((PrintSExpression *)this,(Loop *)curr);
      return;
    case BreakId:
    case SwitchId:
    case CallId:
    case CallIndirectId:
    case LocalGetId:
    case LocalSetId:
    case GlobalGetId:
    case GlobalSetId:
    case LoadId:
    case StoreId:
    case ConstId:
    case UnaryId:
    case BinaryId:
    case SelectId:
    case DropId:
    case ReturnId:
    case MemorySizeId:
    case MemoryGrowId:
    case NopId:
    case UnreachableId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case AtomicFenceId:
    case SIMDExtractId:
    case SIMDReplaceId:
    case SIMDShuffleId:
    case SIMDTernaryId:
    case SIMDShiftId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case RefNullId:
    case RefIsNullId:
    case RefFuncId:
    case RefEqId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case ThrowId:
    case RethrowId:
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case RefTestId:
    case BrOnId:
    case ArrayLenId:
    case RefAsId:
    case StringNewId:
    case StringConstId:
    case StringMeasureId:
    case StringEncodeId:
    case StringConcatId:
    case StringEqId:
    case StringWTF16GetId:
    case StringSliceWTFId:
    case SuspendId:
      PrintSExpression::visitExpression((PrintSExpression *)this,curr);
      return;
    case TryId:
      PrintSExpression::visitTry((PrintSExpression *)this,(Try *)curr);
      return;
    case TryTableId:
      PrintSExpression::visitTryTable((PrintSExpression *)this,(TryTable *)curr);
      return;
    case CallRefId:
      PrintSExpression::visitCallRef((PrintSExpression *)this,(CallRef *)curr);
      return;
    case RefCastId:
      PrintSExpression::visitRefCast((PrintSExpression *)this,(RefCast *)curr);
      return;
    case StructNewId:
      PrintSExpression::visitStructNew((PrintSExpression *)this,(StructNew *)curr);
      return;
    case StructGetId:
      PrintSExpression::visitStructGet((PrintSExpression *)this,(StructGet *)curr);
      return;
    case StructSetId:
      PrintSExpression::visitStructSet((PrintSExpression *)this,(StructSet *)curr);
      return;
    case StructRMWId:
      PrintSExpression::visitStructRMW((PrintSExpression *)this,(StructRMW *)curr);
      return;
    case StructCmpxchgId:
      PrintSExpression::visitStructCmpxchg((PrintSExpression *)this,(StructCmpxchg *)curr);
      return;
    case ArrayNewId:
      PrintSExpression::visitArrayNew((PrintSExpression *)this,(ArrayNew *)curr);
      return;
    case ArrayNewDataId:
      PrintSExpression::visitArrayNewData((PrintSExpression *)this,(ArrayNewData *)curr);
      return;
    case ArrayNewElemId:
      PrintSExpression::visitArrayNewElem((PrintSExpression *)this,(ArrayNewElem *)curr);
      return;
    case ArrayNewFixedId:
      PrintSExpression::visitArrayNewFixed((PrintSExpression *)this,(ArrayNewFixed *)curr);
      return;
    case ArrayGetId:
      PrintSExpression::visitArrayGet((PrintSExpression *)this,(ArrayGet *)curr);
      return;
    case ArraySetId:
      PrintSExpression::visitArraySet((PrintSExpression *)this,(ArraySet *)curr);
      return;
    case ArrayCopyId:
      PrintSExpression::visitArrayCopy((PrintSExpression *)this,(ArrayCopy *)curr);
      return;
    case ArrayFillId:
      PrintSExpression::visitArrayFill((PrintSExpression *)this,(ArrayFill *)curr);
      return;
    case ArrayInitDataId:
      PrintSExpression::visitArrayInitData((PrintSExpression *)this,(ArrayInitData *)curr);
      return;
    case ArrayInitElemId:
      PrintSExpression::visitArrayInitElem((PrintSExpression *)this,(ArrayInitElem *)curr);
      return;
    case ContNewId:
      PrintSExpression::visitContNew((PrintSExpression *)this,(ContNew *)curr);
      return;
    case ContBindId:
      PrintSExpression::visitContBind((PrintSExpression *)this,(ContBind *)curr);
      return;
    case ResumeId:
      PrintSExpression::visitResume((PrintSExpression *)this,(Resume *)curr);
      return;
    case ResumeThrowId:
      PrintSExpression::visitResumeThrow((PrintSExpression *)this,(ResumeThrow *)curr);
      return;
    case StackSwitchId:
      PrintSExpression::visitStackSwitch((PrintSExpression *)this,(StackSwitch *)curr);
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrintSExpression>::visit(Expression *) [SubType = wasm::PrintSExpression, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }